

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

IOTHUB_DEVICE_CLIENT_LL_HANDLE
create_device_client
          (BACK_COMPAT_INFO *back_compat_info,DEVICE_CREATION_TYPE type,
          IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  int iVar1;
  TRANSPORT_HANDLE pTVar2;
  undefined1 local_e1;
  LOGGER_LOG p_Stack_e0;
  _Bool trace_on;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_DEVICE_CONFIG device_config;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CONFIG client_config_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CONFIG client_config;
  IOTHUB_PROVISIONED_DEVICE *device_info;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  DEVICE_CREATION_TYPE type_local;
  BACK_COMPAT_INFO *back_compat_info_local;
  
  client_config.protocolGatewayHostName =
       (char *)IoTHubAccount_GetSASDevice(back_compat_info->acct_info);
  if (type == DEVICE_CREATION_CONN_STRING) {
    device_info = (IOTHUB_PROVISIONED_DEVICE *)
                  IoTHubDeviceClient_LL_CreateFromConnectionString
                            (((IOTHUB_PROVISIONED_DEVICE *)client_config.protocolGatewayHostName)->
                             connectionString,protocol);
  }
  else if (type == DEVICE_CREATION_CREATE) {
    memset(&l,0,0x38);
    iVar1 = parse_connection_string
                      ((IOTHUB_PROVISIONED_DEVICE *)client_config.protocolGatewayHostName,
                       (IOTHUB_CLIENT_CONFIG *)&l);
    if (iVar1 == 0) {
      l = (LOGGER_LOG)protocol;
      device_info = (IOTHUB_PROVISIONED_DEVICE *)
                    IoTHubDeviceClient_LL_Create((IOTHUB_CLIENT_CONFIG *)&l);
      cleanup_config_object((IOTHUB_CLIENT_CONFIG *)&l);
    }
    else {
      client_config_1.protocolGatewayHostName = (char *)xlogging_get_log_function();
      if ((LOGGER_LOG)client_config_1.protocolGatewayHostName != (LOGGER_LOG)0x0) {
        (*(code *)client_config_1.protocolGatewayHostName)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                   ,"create_device_client",0x14b,1,"Failure parsing connection string");
      }
      device_info = (IOTHUB_PROVISIONED_DEVICE *)0x0;
    }
  }
  else {
    if (type == DEVICE_CREATION_WITH_TRANSPORT) {
      memset(&l_1,0,0x38);
      iVar1 = parse_connection_string
                        ((IOTHUB_PROVISIONED_DEVICE *)client_config.protocolGatewayHostName,
                         (IOTHUB_CLIENT_CONFIG *)&l_1);
      if (iVar1 == 0) {
        pTVar2 = IoTHubTransport_Create
                           (protocol,client_config_1.deviceSasToken,client_config_1.iotHubName);
        back_compat_info->transport_handle = pTVar2;
        if (pTVar2 == (TRANSPORT_HANDLE)0x0) {
          device_config.transportHandle = client_config_1.protocol;
          device_config.deviceId = client_config_1.deviceId;
          device_config.protocol =
               (IOTHUB_CLIENT_TRANSPORT_PROVIDER)back_compat_info->transport_handle;
          l_2 = (LOGGER_LOG)protocol;
          IoTHubDeviceClient_LL_CreateWithTransport((IOTHUB_CLIENT_DEVICE_CONFIG *)&l_2);
        }
        cleanup_config_object((IOTHUB_CLIENT_CONFIG *)&l_1);
      }
      else {
        device_config.deviceSasToken = (char *)xlogging_get_log_function();
        if ((LOGGER_LOG)device_config.deviceSasToken != (LOGGER_LOG)0x0) {
          (*(code *)device_config.deviceSasToken)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                     ,"create_device_client",0x15b,1,"Failure parsing connection string");
        }
      }
    }
    p_Stack_e0 = xlogging_get_log_function();
    if (p_Stack_e0 != (LOGGER_LOG)0x0) {
      (*p_Stack_e0)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"create_device_client",0x16f,1,"Failure unknown creation type %d",type);
    }
    device_info = (IOTHUB_PROVISIONED_DEVICE *)0x0;
  }
  if (device_info != (IOTHUB_PROVISIONED_DEVICE *)0x0) {
    local_e1 = 1;
    IoTHubDeviceClient_LL_SetOption
              ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)device_info,OPTION_LOG_TRACE,&local_e1);
  }
  return (IOTHUB_DEVICE_CLIENT_LL_HANDLE)device_info;
}

Assistant:

static IOTHUB_DEVICE_CLIENT_LL_HANDLE create_device_client(BACK_COMPAT_INFO* back_compat_info, DEVICE_CREATION_TYPE type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_DEVICE_CLIENT_LL_HANDLE result;

    IOTHUB_PROVISIONED_DEVICE* device_info = IoTHubAccount_GetSASDevice(back_compat_info->acct_info);

    switch (type)
    {
        case DEVICE_CREATION_CONN_STRING:
            result = IoTHubDeviceClient_LL_CreateFromConnectionString(device_info->connectionString, protocol);
            break;
        case DEVICE_CREATION_CREATE:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                client_config.protocol = protocol;
                result = IoTHubDeviceClient_LL_Create(&client_config);
                cleanup_config_object(&client_config);
            }
            break;
        }
        case DEVICE_CREATION_WITH_TRANSPORT:
        {
            IOTHUB_CLIENT_CONFIG client_config = { 0 };
            if (parse_connection_string(device_info, &client_config) != 0)
            {
                LogError("Failure parsing connection string");
                result = NULL;
            }
            else
            {
                if ((back_compat_info->transport_handle = IoTHubTransport_Create(protocol, client_config.iotHubName, client_config.iotHubSuffix)) == NULL)
                {
                    IOTHUB_CLIENT_DEVICE_CONFIG device_config;
                    device_config.deviceId = client_config.deviceId;
                    device_config.deviceKey = client_config.deviceKey;
                    device_config.protocol = protocol;
                    device_config.transportHandle = back_compat_info->transport_handle;

                    result = IoTHubDeviceClient_LL_CreateWithTransport(&device_config);
                }
                cleanup_config_object(&client_config);
            }
        }
        default:
        {
            LogError("Failure unknown creation type %d", (int)type);
            result = NULL;
            break;
        }
    }
    // Always set the log trace option
    if (result != NULL)
    {
        bool trace_on = true;
        IoTHubDeviceClient_LL_SetOption(result, OPTION_LOG_TRACE, &trace_on);
    }
    return result;
}